

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

bool __thiscall
xsettingsd::SettingsManager::CreateWindow
          (SettingsManager *this,int screen,Window *win_out,Time *timestamp_out)

{
  Display *pDVar1;
  char *pcVar2;
  Window WVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  ulong in_stack_fffffffffffffe18;
  ulong in_stack_fffffffffffffe20;
  undefined4 uVar8;
  undefined8 uVar7;
  int local_170 [2];
  XEvent event;
  Window WStack_a8;
  pid_t pid;
  Window win;
  XSetWindowAttributes attr;
  Time *timestamp_out_local;
  Window *win_out_local;
  int screen_local;
  SettingsManager *this_local;
  
  attr.cursor = (Cursor)timestamp_out;
  if (win_out == (Window *)0x0) {
    __assert_fail("win_out",
                  "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/settings_manager.cc"
                  ,0xb5,"bool xsettingsd::SettingsManager::CreateWindow(int, Window *, Time *)");
  }
  if (timestamp_out == (Time *)0x0) {
    __assert_fail("timestamp_out",
                  "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/settings_manager.cc"
                  ,0xb6,"bool xsettingsd::SettingsManager::CreateWindow(int, Window *, Time *)");
  }
  if ((screen < 0) || (*(int *)(this->display_ + 0xe4) <= screen)) {
    this_local._7_1_ = false;
  }
  else {
    attr.do_not_propagate_mask._0_4_ = 1;
    WStack_a8 = XCreateWindow(this->display_,
                              *(undefined8 *)
                               (*(long *)(this->display_ + 0xe8) + (long)screen * 0x80 + 0x10),
                              0xffffffff,0xffffffff,1,1,
                              in_stack_fffffffffffffe18 & 0xffffffff00000000,
                              in_stack_fffffffffffffe20 & 0xffffffff00000000,1,0,0x200,&win);
    if (WStack_a8 == 0) {
      this_local._7_1_ = false;
    }
    else {
      *win_out = WStack_a8;
      uVar8 = 0;
      XSetWMProperties(this->display_,WStack_a8,0,0,0,0,0,0,0);
      XStoreName(this->display_,WStack_a8,kProgName);
      WVar3 = WStack_a8;
      pDVar1 = this->display_;
      uVar4 = XInternAtom(this->display_,"_NET_WM_NAME",0);
      uVar5 = XInternAtom(this->display_,"UTF8_STRING",0);
      pcVar2 = kProgName;
      sVar6 = strlen(kProgName);
      uVar7 = CONCAT44(uVar8,(int)sVar6);
      XChangeProperty(pDVar1,WVar3,uVar4,uVar5,8,0,pcVar2,uVar7);
      uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
      event.pad[0x17]._4_4_ = getpid();
      XSelectInput(this->display_,WStack_a8,0x400000);
      WVar3 = WStack_a8;
      pDVar1 = this->display_;
      uVar4 = XInternAtom(this->display_,"_NET_WM_PID",0);
      XChangeProperty(pDVar1,WVar3,uVar4,6,0x20,0,(long)&event + 0xbc,CONCAT44(uVar8,1));
      XSelectInput(this->display_,WStack_a8,0);
      do {
        XWindowEvent(this->display_,WStack_a8,0x400000,local_170);
      } while (local_170[0] != 0x1c);
      *(Window *)attr.cursor = event.xkey.root;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SettingsManager::CreateWindow(int screen,
                                   Window* win_out,
                                   Time* timestamp_out) {
  assert(win_out);
  assert(timestamp_out);

  if (screen < 0 || screen >= ScreenCount(display_))
    return false;

  XSetWindowAttributes attr;
  attr.override_redirect = True;
  Window win = XCreateWindow(display_,
                             RootWindow(display_, screen),  // parent
                             -1, -1,                        // x, y
                             1, 1,                          // width, height
                             0,                             // border_width
                             CopyFromParent,                // depth
                             InputOutput,                   // class
                             CopyFromParent,                // visual
                             CWOverrideRedirect,            // attr_mask
                             &attr);
  if (win == None)
    return false;
  *win_out = win;

  // This sets a few properties for us, including WM_CLIENT_MACHINE.
  XSetWMProperties(display_,
                   win,
                   NULL,   // window_name
                   NULL,   // icon_name
                   NULL,   // argv
                   0,      // argc
                   NULL,   // normal_hints
                   NULL,   // wm_hints
                   NULL);  // class_hints

  XStoreName(display_, win, kProgName);
  XChangeProperty(display_,
                  win,
                  XInternAtom(display_, "_NET_WM_NAME", False),  // property
                  XInternAtom(display_, "UTF8_STRING", False),   // type
                  8,  // format (bits per element)
                  PropModeReplace,
                  reinterpret_cast<const unsigned char*>(kProgName),
                  strlen(kProgName));

  // Grab a timestamp from our final property change; we'll need it later
  // when announcing that we've taken the manager selection.
  pid_t pid = getpid();
  XSelectInput(display_, win, PropertyChangeMask);
  XChangeProperty(display_,
                  win,
                  XInternAtom(display_, "_NET_WM_PID", False),  // property
                  XA_CARDINAL,  // type
                  32,           // format (bits per element)
                  PropModeReplace,
                  reinterpret_cast<const unsigned char*>(&pid), // value
                  1);           // num elements
  XSelectInput(display_, win, NoEventMask);

  XEvent event;
  while (true) {
    XWindowEvent(display_, win, PropertyChangeMask, &event);
    if (event.type == PropertyNotify) {
      *timestamp_out = event.xproperty.time;
      break;
    }
  }

  return true;
}